

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O0

int anon_unknown.dwarf_9e99::set_param_imp<char>(global_state_t *g,char *param,char *value)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *in_RDX;
  unsigned_long *in_RSI;
  long in_RDI;
  int ret_1;
  int hardware_cpu_count_1;
  int ret;
  int max_cpu_count;
  int hardware_cpu_count;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_RSI == (unsigned_long *)0x0) {
    local_4 = 3;
  }
  else if (in_RDX == (char *)0x0) {
    local_4 = 3;
  }
  else {
    bVar1 = strmatch((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (bVar1) {
      bVar1 = always_force_reduce();
      if (bVar1) {
        local_4 = 4;
      }
      else {
        local_4 = (anonymous_namespace)::store_bool<int,char>
                            ((int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                             (char *)0x10e8f1);
      }
    }
    else {
      bVar1 = strmatch((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (bVar1) {
        if (cilkg_singleton_ptr == (global_state_t *)0x0) {
          iVar4 = __cilkrts_hardware_cpu_count();
          if (iVar4 < 1) {
            __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/global_state.cpp"
                          ,0x10d,"hardware_cpu_count > 0");
          }
          iVar2 = iVar4 << 4;
          iVar3 = __cilkrts_running_under_sequential_ptool();
          if (iVar3 != 0) {
            iVar4 = 1;
            iVar2 = 1;
          }
          local_4 = (anonymous_namespace)::store_int<int,char>
                              ((int *)CONCAT44(iVar4,iVar2),
                               (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                               ,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
          if (*(int *)(in_RDI + 0x528) == 0) {
            *(int *)(in_RDI + 0x528) = iVar4;
          }
        }
        else {
          local_4 = 4;
        }
      }
      else {
        bVar1 = strmatch((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        if (bVar1) {
          iVar4 = __cilkrts_hardware_cpu_count();
          if (iVar4 < 1) {
            __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/global_state.cpp"
                          ,0x121,"hardware_cpu_count > 0");
          }
          local_4 = (anonymous_namespace)::store_int<int,char>
                              ((int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                               (char *)CONCAT44(in_stack_ffffffffffffffd4,iVar4),
                               in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
        }
        else {
          bVar1 = strmatch((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          if (bVar1) {
            local_4 = (anonymous_namespace)::store_int<int,char>
                                ((int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),
                                 (char *)CONCAT44(in_stack_ffffffffffffffd4,
                                                  in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
          }
          else {
            bVar1 = strmatch((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
            if (bVar1) {
              local_4 = (anonymous_namespace)::store_int<int,char>
                                  ((int *)CONCAT44(in_stack_ffffffffffffffdc,
                                                   in_stack_ffffffffffffffd8),
                                   (char *)CONCAT44(in_stack_ffffffffffffffd4,
                                                    in_stack_ffffffffffffffd0),
                                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
            }
            else {
              bVar1 = strmatch((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                               ,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                ));
              if (bVar1) {
                if (cilkg_singleton_ptr == (global_state_t *)0x0) {
                  local_4 = (anonymous_namespace)::store_int<unsigned_int,char>
                                      ((uint *)CONCAT44(in_stack_ffffffffffffffdc,
                                                        in_stack_ffffffffffffffd8),
                                       (char *)CONCAT44(in_stack_ffffffffffffffd4,
                                                        in_stack_ffffffffffffffd0),
                                       in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
                }
                else {
                  local_4 = 4;
                }
              }
              else {
                bVar1 = strmatch((char *)CONCAT44(in_stack_ffffffffffffffd4,
                                                  in_stack_ffffffffffffffd0),
                                 (char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8));
                if (bVar1) {
                  if (cilkg_singleton_ptr == (global_state_t *)0x0) {
                    local_4 = (anonymous_namespace)::store_int<unsigned_long,char>
                                        (in_RSI,in_RDX,
                                         CONCAT44(in_stack_ffffffffffffffdc,
                                                  in_stack_ffffffffffffffd8),
                                         CONCAT44(in_stack_ffffffffffffffd4,
                                                  in_stack_ffffffffffffffd0));
                    sVar5 = cilkos_validate_stack_size(*(size_t *)(in_RDI + 0x3c0));
                    *(size_t *)(in_RDI + 0x3c0) = sVar5;
                  }
                  else {
                    local_4 = 4;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int set_param_imp(global_state_t* g, const CHAR_T* param, const CHAR_T* value)
{
    static const char* const s_force_reduce     = "force reduce";
    static const char* const s_nworkers         = "nworkers";
    static const char* const s_max_user_workers = "max user workers";
    static const char* const s_local_stacks     = "local stacks";
    static const char* const s_shared_stacks    = "shared stacks";
    static const char* const s_nstacks          = "nstacks";
    static const char* const s_stack_size       = "stack size";

    // We must have a parameter and a value
    if (0 == param)
        return __CILKRTS_SET_PARAM_INVALID;
    if (0 == value)
        return __CILKRTS_SET_PARAM_INVALID;

    if (strmatch(param, s_force_reduce))
    {
        // Sets whether we force a reduce operation at every sync.  Useful for
        // debugging reducers.  Off by default.  Overridden by Cilkscreen
        //
        // Documented in cilk_api_<os>.h
        if (always_force_reduce())
            // Force reduce is set by cilkscreen.  User cannot change it.
            return __CILKRTS_SET_PARAM_LATE;

        return store_bool(&g->force_reduce, value);
    }
    else if (strmatch(param, s_nworkers))
    {
        // Set the total number of workers.  Overrides count of cores we get
        // from the OS and the setting of the CILK_NWORKERS environment
        // variable.  Setting to 0 indicates that the default worker count
        // should be used.
        //
        // Documented in cilk_api_<os>.h
        if (cilkg_singleton_ptr)
            return __CILKRTS_SET_PARAM_LATE;

        // Fetch the number of cores.  There must be at last 1, since we're
        // executing on *something*, aren't we!?
        int hardware_cpu_count = __cilkrts_hardware_cpu_count();
        CILK_ASSERT(hardware_cpu_count > 0);

        int max_cpu_count = 16 * hardware_cpu_count;
        if (__cilkrts_running_under_sequential_ptool())
        {
            hardware_cpu_count = 1;
            max_cpu_count = 1;
        }
        // Allow a value of 0, which means "set to hardware thread count".
        int ret = store_int(&g->P, value, 0, max_cpu_count);
        if (0 == g->P)
            g->P = hardware_cpu_count;
        return ret;
    }
    else if (strmatch(param, s_max_user_workers))
    {
        // ** UNDOCUMENTED **
        //
        // Sets the number of slots allocated for user worker threads
        int hardware_cpu_count = __cilkrts_hardware_cpu_count();
        CILK_ASSERT (hardware_cpu_count > 0);

        return store_int(&g->max_user_workers, value, 1,
                         16 * hardware_cpu_count);
    }
    else if (strmatch(param, s_local_stacks))
    {
        // ** UNDOCUMENTED **
        //
        // Number of stacks we'll hold in the per-worker stack cache.  Maximum
        // value is 42.  See __cilkrts_make_global_state for details.
        return store_int(&g->fiber_pool_size, value, 0, 42);
    }
    else if (strmatch(param, s_shared_stacks))
    {
        // ** UNDOCUMENTED **
        //
        // Maximum number of stacks we'll hold in the global stack
        // cache. Maximum value is 42.  See __cilkrts_make_global_state for
        // details.
        return store_int(&g->global_fiber_pool_size, value, 0, 42);
    }
    else if (strmatch(param, s_nstacks))
    {
        // Sets the maximum number of stacks permitted at one time.  If the
        // runtime reaches this maximum, it will cease to allocate stacks and
        // the app will lose parallelism.  0 means unlimited.  Default is
        // unlimited.  Minimum is twice the number of worker threads, though
        // that cannot be tested at this time.
        //
        // Undocumented at this time, though there are plans to expose it.
        // The current implentation is for Linux debugging only and is not
        // robust enough for users.
        if (cilkg_singleton_ptr)
            return __CILKRTS_SET_PARAM_LATE;
        return store_int<unsigned>(&g->max_stacks, value, 0, INT_MAX);
    }
    else if (strmatch(param, s_stack_size))
    {
        // ** UNDOCUMENTED **
        //
        // Sets the size (in bytes) of the stacks that Cilk creates.
        // Can only be set before the runtime starts.
        if (cilkg_singleton_ptr)
            return __CILKRTS_SET_PARAM_LATE;

        // Maximum value that can be parsed is MAX_INT (32-bit).
        int ret = store_int<size_t>(&g->stack_size, value, 0, INT_MAX);

        // Process the value the user set (or 0 if the user didn't set
        // anything) into something nice for the current OS.  This
        // processing is done immediately and stored into
        // g->stack_size so that a call to get stack size will return
        // the value that the runtime will actually use.
        g->stack_size = cilkos_validate_stack_size(g->stack_size);
        return ret;     
    }


    // If got here, then didn't match any of the strings
    return __CILKRTS_SET_PARAM_UNIMP;
}